

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# loop_peeling.cpp
# Opt level: O0

SExpression __thiscall
spvtools::opt::LoopPeelingPass::LoopPeelingInfo::GetValueAtIteration
          (LoopPeelingInfo *this,SERecurrentNode *rec,int64_t iteration)

{
  SENode *pSVar1;
  SExpression SVar2;
  SExpression local_60;
  undefined1 auStack_50 [8];
  SExpression offset;
  SExpression coeff;
  int64_t iteration_local;
  SERecurrentNode *rec_local;
  LoopPeelingInfo *this_local;
  
  pSVar1 = SERecurrentNode::GetCoefficient(rec);
  SExpression::SExpression((SExpression *)&offset.scev_,pSVar1);
  pSVar1 = SERecurrentNode::GetOffset(rec);
  SExpression::SExpression((SExpression *)auStack_50,pSVar1);
  local_60 = SExpression::operator*<long,_0>((SExpression *)&offset.scev_,iteration);
  SVar2.scev_ = (ScalarEvolutionAnalysis *)offset.node_;
  SVar2.node_ = (SENode *)auStack_50;
  SVar2 = SExpression::operator+(&local_60,SVar2);
  return SVar2;
}

Assistant:

SExpression LoopPeelingPass::LoopPeelingInfo::GetValueAtIteration(
    SERecurrentNode* rec, int64_t iteration) const {
  SExpression coeff = rec->GetCoefficient();
  SExpression offset = rec->GetOffset();

  return (coeff * iteration) + offset;
}